

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a2fd0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a2fd7._0_1_ = '-';
    uRam00000000001a2fd7._1_1_ = '-';
    uRam00000000001a2fd7._2_1_ = '-';
    uRam00000000001a2fd7._3_1_ = '-';
    uRam00000000001a2fd7._4_1_ = '-';
    uRam00000000001a2fd7._5_1_ = '-';
    uRam00000000001a2fd7._6_1_ = '-';
    uRam00000000001a2fd7._7_1_ = '-';
    DAT_001a2fc0 = '-';
    DAT_001a2fc0_1._0_1_ = '-';
    DAT_001a2fc0_1._1_1_ = '-';
    DAT_001a2fc0_1._2_1_ = '-';
    DAT_001a2fc0_1._3_1_ = '-';
    DAT_001a2fc0_1._4_1_ = '-';
    DAT_001a2fc0_1._5_1_ = '-';
    DAT_001a2fc0_1._6_1_ = '-';
    uRam00000000001a2fc8 = 0x2d2d2d2d2d2d2d;
    DAT_001a2fcf = 0x2d;
    DAT_001a2fb0 = '-';
    DAT_001a2fb0_1._0_1_ = '-';
    DAT_001a2fb0_1._1_1_ = '-';
    DAT_001a2fb0_1._2_1_ = '-';
    DAT_001a2fb0_1._3_1_ = '-';
    DAT_001a2fb0_1._4_1_ = '-';
    DAT_001a2fb0_1._5_1_ = '-';
    DAT_001a2fb0_1._6_1_ = '-';
    uRam00000000001a2fb8._0_1_ = '-';
    uRam00000000001a2fb8._1_1_ = '-';
    uRam00000000001a2fb8._2_1_ = '-';
    uRam00000000001a2fb8._3_1_ = '-';
    uRam00000000001a2fb8._4_1_ = '-';
    uRam00000000001a2fb8._5_1_ = '-';
    uRam00000000001a2fb8._6_1_ = '-';
    uRam00000000001a2fb8._7_1_ = '-';
    DAT_001a2fa0 = '-';
    DAT_001a2fa0_1._0_1_ = '-';
    DAT_001a2fa0_1._1_1_ = '-';
    DAT_001a2fa0_1._2_1_ = '-';
    DAT_001a2fa0_1._3_1_ = '-';
    DAT_001a2fa0_1._4_1_ = '-';
    DAT_001a2fa0_1._5_1_ = '-';
    DAT_001a2fa0_1._6_1_ = '-';
    uRam00000000001a2fa8._0_1_ = '-';
    uRam00000000001a2fa8._1_1_ = '-';
    uRam00000000001a2fa8._2_1_ = '-';
    uRam00000000001a2fa8._3_1_ = '-';
    uRam00000000001a2fa8._4_1_ = '-';
    uRam00000000001a2fa8._5_1_ = '-';
    uRam00000000001a2fa8._6_1_ = '-';
    uRam00000000001a2fa8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a2f98._0_1_ = '-';
    uRam00000000001a2f98._1_1_ = '-';
    uRam00000000001a2f98._2_1_ = '-';
    uRam00000000001a2f98._3_1_ = '-';
    uRam00000000001a2f98._4_1_ = '-';
    uRam00000000001a2f98._5_1_ = '-';
    uRam00000000001a2f98._6_1_ = '-';
    uRam00000000001a2f98._7_1_ = '-';
    DAT_001a2fdf = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar2,'\n');
  colourGuard.m_moved = false;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&lineInfo);
  std::operator<<((ostream *)os,'\n');
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a3070 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a3077._0_1_ = '.';
    uRam00000000001a3077._1_1_ = '.';
    uRam00000000001a3077._2_1_ = '.';
    uRam00000000001a3077._3_1_ = '.';
    uRam00000000001a3077._4_1_ = '.';
    uRam00000000001a3077._5_1_ = '.';
    uRam00000000001a3077._6_1_ = '.';
    uRam00000000001a3077._7_1_ = '.';
    DAT_001a3060 = '.';
    DAT_001a3060_1._0_1_ = '.';
    DAT_001a3060_1._1_1_ = '.';
    DAT_001a3060_1._2_1_ = '.';
    DAT_001a3060_1._3_1_ = '.';
    DAT_001a3060_1._4_1_ = '.';
    DAT_001a3060_1._5_1_ = '.';
    DAT_001a3060_1._6_1_ = '.';
    uRam00000000001a3068 = 0x2e2e2e2e2e2e2e;
    DAT_001a306f = 0x2e;
    DAT_001a3050 = '.';
    DAT_001a3050_1._0_1_ = '.';
    DAT_001a3050_1._1_1_ = '.';
    DAT_001a3050_1._2_1_ = '.';
    DAT_001a3050_1._3_1_ = '.';
    DAT_001a3050_1._4_1_ = '.';
    DAT_001a3050_1._5_1_ = '.';
    DAT_001a3050_1._6_1_ = '.';
    uRam00000000001a3058._0_1_ = '.';
    uRam00000000001a3058._1_1_ = '.';
    uRam00000000001a3058._2_1_ = '.';
    uRam00000000001a3058._3_1_ = '.';
    uRam00000000001a3058._4_1_ = '.';
    uRam00000000001a3058._5_1_ = '.';
    uRam00000000001a3058._6_1_ = '.';
    uRam00000000001a3058._7_1_ = '.';
    DAT_001a3040 = '.';
    DAT_001a3040_1._0_1_ = '.';
    DAT_001a3040_1._1_1_ = '.';
    DAT_001a3040_1._2_1_ = '.';
    DAT_001a3040_1._3_1_ = '.';
    DAT_001a3040_1._4_1_ = '.';
    DAT_001a3040_1._5_1_ = '.';
    DAT_001a3040_1._6_1_ = '.';
    uRam00000000001a3048._0_1_ = '.';
    uRam00000000001a3048._1_1_ = '.';
    uRam00000000001a3048._2_1_ = '.';
    uRam00000000001a3048._3_1_ = '.';
    uRam00000000001a3048._4_1_ = '.';
    uRam00000000001a3048._5_1_ = '.';
    uRam00000000001a3048._6_1_ = '.';
    uRam00000000001a3048._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a3038._0_1_ = '.';
    uRam00000000001a3038._1_1_ = '.';
    uRam00000000001a3038._2_1_ = '.';
    uRam00000000001a3038._3_1_ = '.';
    uRam00000000001a3038._4_1_ = '.';
    uRam00000000001a3038._5_1_ = '.';
    uRam00000000001a3038._6_1_ = '.';
    uRam00000000001a3038._7_1_ = '.';
    DAT_001a307f = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::endl<char,std::char_traits<char>>(poVar2);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}